

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RowidConstraint(Parse *pParse,int onError,Table *pTab)

{
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  int rc;
  char *unaff_retaddr;
  char *zMsg;
  undefined2 uVar1;
  
  if (*(short *)((long)in_RDX + 0x34) < 0) {
    sqlite3MPrintf((sqlite3 *)*in_RDI,"%s.rowid",*in_RDX);
    uVar1 = (undefined2)((ulong)in_RDI >> 0x30);
  }
  else {
    sqlite3MPrintf((sqlite3 *)*in_RDI,"%s.%s",*in_RDX,
                   *(undefined8 *)(in_RDX[1] + (long)*(short *)((long)in_RDX + 0x34) * 0x10));
    uVar1 = (undefined2)((ulong)in_RDI >> 0x30);
  }
  sqlite3HaltConstraint
            ((Parse *)pTab,zMsg._4_4_,(int)zMsg,unaff_retaddr,(i8)((ushort)uVar1 >> 8),(u8)uVar1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowidConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Conflict resolution algorithm */
  Table *pTab       /* The table with the non-unique rowid */
){
  char *zMsg;
  int rc;
  if( pTab->iPKey>=0 ){
    zMsg = sqlite3MPrintf(pParse->db, "%s.%s", pTab->zName,
                          pTab->aCol[pTab->iPKey].zCnName);
    rc = SQLITE_CONSTRAINT_PRIMARYKEY;
  }else{
    zMsg = sqlite3MPrintf(pParse->db, "%s.rowid", pTab->zName);
    rc = SQLITE_CONSTRAINT_ROWID;
  }
  sqlite3HaltConstraint(pParse, rc, onError, zMsg, P4_DYNAMIC,
                        P5_ConstraintUnique);
}